

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O2

void __thiscall NaControlLaw::Reset(NaControlLaw *this)

{
  uint uVar1;
  NaDataFile *pNVar2;
  
  NaPrintLog("Control law (set point) init\n");
  switch(this->source) {
  case clsDescription:
    uVar1 = (this->items).nItems;
    TotalTimeLength(this);
    NaPrintLog("..description (%d items) with total duration %g s\n",(ulong)uVar1);
    return;
  case clsFromFile:
    NaPrintLog("..from file \"%s\"\n",this->filepath);
    pNVar2 = OpenInputDataFile(this->filepath);
    this->dataio = pNVar2;
    (*pNVar2->_vptr_NaDataFile[5])(pNVar2);
    this->prev_index = 0;
    break;
  case clsManual:
    NaPrintLog("..manual from value %g\n",this->start_value);
    this->current_value = this->start_value;
    break;
  case clsRandom:
    NaLinearNoiseGen::Reset(&this->lin_rand);
    return;
  }
  return;
}

Assistant:

void    NaControlLaw::Reset ()
{
    NaPrintLog("Control law (set point) init\n");

    switch(source){

    case clsRandom:
        lin_rand.Reset();
        break;

    case clsDescription:
        NaPrintLog("..description (%d items) with total duration %g s\n",
                   items.count(), TotalTimeLength());
        break;

    case clsManual:
        NaPrintLog("..manual from value %g\n", start_value);
        current_value = start_value;
        break;

    case clsFromFile:
        NaPrintLog("..from file \"%s\"\n", filepath);
        try{
            // Open the file
            dataio = OpenInputDataFile(filepath);
            dataio->GoStartRecord();
            prev_index = 0;
        }
        catch(NaException exCode){
            // Handle file exceptions
            dataio = NULL;
            NaPrintLog("..can't open file \"%s\": exception code %d\n",
                       filepath, -1);
        }
        break;
    }
}